

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_5908b1::TestPresetOutputVerbosityHelper(VerbosityEnum *out,Value *value)

{
  bool bVar1;
  VerbosityEnum VVar2;
  String local_50;
  
  VVar2 = Default;
  if (value != (Value *)0x0) {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      return INVALID_PRESET;
    }
    Json::Value::asString_abi_cxx11_(&local_50,value);
    bVar1 = std::operator==(&local_50,"default");
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      bVar1 = std::operator==(&local_50,"verbose");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        VVar2 = Verbose;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        bVar1 = std::operator==(&local_50,"extra");
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar1) {
          return INVALID_PRESET;
        }
        VVar2 = Extra;
      }
    }
  }
  *out = VVar2;
  return READ_OK;
}

Assistant:

ReadFileResult TestPresetOutputVerbosityHelper(
  TestPreset::OutputOptions::VerbosityEnum& out, const Json::Value* value)
{
  if (!value) {
    out = TestPreset::OutputOptions::VerbosityEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "default") {
    out = TestPreset::OutputOptions::VerbosityEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "verbose") {
    out = TestPreset::OutputOptions::VerbosityEnum::Verbose;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "extra") {
    out = TestPreset::OutputOptions::VerbosityEnum::Extra;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}